

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setCategoryWeights
          (BeagleCPUImpl<float,_1,_0> *this,int categoryWeightsIndex,double *inCategoryWeights)

{
  double *pdVar1;
  float *pfVar2;
  uint uVar3;
  float **ppfVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  int iVar14;
  float *pfVar15;
  ulong uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  
  iVar14 = -5;
  if ((-1 < categoryWeightsIndex) && (iVar14 = -5, categoryWeightsIndex < this->kEigenDecompCount))
  {
    ppfVar4 = this->gCategoryWeights;
    if (ppfVar4[(uint)categoryWeightsIndex] == (float *)0x0) {
      pfVar15 = (float *)malloc((long)this->kCategoryCount << 2);
      ppfVar4[(uint)categoryWeightsIndex] = pfVar15;
      if (this->gCategoryWeights[(uint)categoryWeightsIndex] == (float *)0x0) {
        return -2;
      }
    }
    uVar3 = this->kCategoryCount;
    if ((ulong)uVar3 == 0) {
      iVar14 = 0;
    }
    else {
      pfVar15 = this->gCategoryWeights[(uint)categoryWeightsIndex];
      auVar18 = vpbroadcastq_avx512f();
      iVar14 = 0;
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar16 = 0;
      do {
        auVar20 = vpbroadcastq_avx512f();
        auVar20 = vporq_avx512f(auVar20,auVar19);
        uVar13 = vpcmpuq_avx512f(auVar20,auVar18,2);
        pdVar1 = inCategoryWeights + uVar16;
        auVar20._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * (long)pdVar1[1];
        auVar20._0_8_ = (ulong)((byte)uVar13 & 1) * (long)*pdVar1;
        auVar20._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * (long)pdVar1[2];
        auVar20._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * (long)pdVar1[3];
        auVar20._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * (long)pdVar1[4];
        auVar20._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * (long)pdVar1[5];
        auVar20._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * (long)pdVar1[6];
        auVar20._56_8_ = (uVar13 >> 7) * (long)pdVar1[7];
        auVar17 = vcvtpd2ps_avx512f(auVar20);
        pfVar2 = pfVar15 + uVar16;
        bVar5 = (bool)((byte)uVar13 & 1);
        bVar6 = (bool)((byte)(uVar13 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar13 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar13 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar13 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar13 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
        bVar12 = SUB81(uVar13 >> 7,0);
        *pfVar2 = (float)((uint)bVar5 * auVar17._0_4_ | (uint)!bVar5 * (int)*pfVar2);
        pfVar2[1] = (float)((uint)bVar6 * auVar17._4_4_ | (uint)!bVar6 * (int)pfVar2[1]);
        pfVar2[2] = (float)((uint)bVar7 * auVar17._8_4_ | (uint)!bVar7 * (int)pfVar2[2]);
        pfVar2[3] = (float)((uint)bVar8 * auVar17._12_4_ | (uint)!bVar8 * (int)pfVar2[3]);
        pfVar2[4] = (float)((uint)bVar9 * auVar17._16_4_ | (uint)!bVar9 * (int)pfVar2[4]);
        pfVar2[5] = (float)((uint)bVar10 * auVar17._20_4_ | (uint)!bVar10 * (int)pfVar2[5]);
        pfVar2[6] = (float)((uint)bVar11 * auVar17._24_4_ | (uint)!bVar11 * (int)pfVar2[6]);
        pfVar2[7] = (float)((uint)bVar12 * auVar17._28_4_ | (uint)!bVar12 * (int)pfVar2[7]);
        uVar16 = uVar16 + 8;
      } while (((ulong)uVar3 + 7 & 0xfffffffffffffff8) != uVar16);
    }
  }
  return iVar14;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setCategoryWeights(int categoryWeightsIndex,
                                                 const double* inCategoryWeights) {
    if (categoryWeightsIndex < 0 || categoryWeightsIndex >= kEigenDecompCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gCategoryWeights[categoryWeightsIndex] == NULL) {
        gCategoryWeights[categoryWeightsIndex] = (REALTYPE*) malloc(sizeof(REALTYPE) * kCategoryCount);
        if (gCategoryWeights[categoryWeightsIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    beagleMemCpy(gCategoryWeights[categoryWeightsIndex], inCategoryWeights, kCategoryCount);

    return BEAGLE_SUCCESS;
}